

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

char * __thiscall
cmLocalGenerator::GetFeature(cmLocalGenerator *this,string *feature,string *config)

{
  pointer pcVar1;
  char *pcVar2;
  string featureConfig;
  string local_68;
  string local_48;
  
  if (config->_M_string_length != 0) {
    pcVar1 = (feature->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + feature->_M_string_length);
    std::__cxx11::string::append((char *)&local_68);
    cmsys::SystemTools::UpperCase(&local_48,config);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = cmMakefile::GetProperty(this->Makefile,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
  }
  pcVar2 = cmMakefile::GetProperty(this->Makefile,feature);
  if (pcVar2 == (char *)0x0) {
    if (this->Parent == (cmLocalGenerator *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = GetFeature(this->Parent,feature,config);
    }
  }
  return pcVar2;
}

Assistant:

const char* cmLocalGenerator::GetFeature(const std::string& feature,
                                         const std::string& config)
{
  // TODO: Define accumulation policy for features (prepend, append, replace).
  // Currently we always replace.
  if(!config.empty())
    {
    std::string featureConfig = feature;
    featureConfig += "_";
    featureConfig += cmSystemTools::UpperCase(config);
    if(const char* value = this->Makefile->GetProperty(featureConfig))
      {
      return value;
      }
    }
  if(const char* value = this->Makefile->GetProperty(feature))
    {
    return value;
    }
  if(cmLocalGenerator* parent = this->GetParent())
    {
    return parent->GetFeature(feature, config);
    }
  return 0;
}